

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O2

uint64_t pac_mult(uint64_t i)

{
  byte bVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int start;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar7 = 0;
  for (uVar10 = 0; uVar10 < 0x10; uVar10 = uVar10 + 4) {
    start = (int)uVar10;
    uVar3 = extract64(i,start,4);
    uVar4 = extract64(i,start + 0x10,4);
    uVar5 = extract64(i,start + 0x20,4);
    uVar6 = extract64(i,start + 0x30,4);
    uVar12 = (uint)uVar5 << 4 | (uint)uVar5;
    uVar14 = uVar12 >> 3;
    uVar8 = (uint)uVar4 << 4 | (uint)uVar4;
    uVar11 = (uint)uVar3 << 4 | (uint)uVar3;
    uVar15 = uVar11 >> 3;
    uVar13 = (uint)uVar6 << 4 | (uint)uVar6;
    uVar2 = uVar13 >> 3;
    uVar9 = uVar8 >> 3;
    bVar1 = (byte)uVar10;
    uVar7 = uVar7 | (ulong)((uVar8 >> 2 ^ uVar15 ^ uVar14) & 0xf) << ((byte)(start + 0x30) & 0x3f) |
                    (ulong)((uVar11 >> 2 ^ uVar9 ^ uVar2) & 0xf) << (bVar1 + 0x20 & 0x3f) |
                    (ulong)((uVar13 >> 2 ^ uVar15 ^ uVar14) & 0xf) << (bVar1 + 0x10 & 0x3f) |
                    (ulong)((uVar12 >> 2 ^ uVar9 ^ uVar2) & 0xf) << (bVar1 & 0x3f);
  }
  return uVar7;
}

Assistant:

static uint64_t pac_mult(uint64_t i)
{
    uint64_t o = 0;
    int b;

    for (b = 0; b < 4 * 4; b += 4) {
        int i0, i4, i8, ic, t0, t1, t2, t3;

        i0 = extract64(i, b, 4);
        i4 = extract64(i, b + 4 * 4, 4);
        i8 = extract64(i, b + 8 * 4, 4);
        ic = extract64(i, b + 12 * 4, 4);

        t0 = rot_cell(i8, 1) ^ rot_cell(i4, 2) ^ rot_cell(i0, 1);
        t1 = rot_cell(ic, 1) ^ rot_cell(i4, 1) ^ rot_cell(i0, 2);
        t2 = rot_cell(ic, 2) ^ rot_cell(i8, 1) ^ rot_cell(i0, 1);
        t3 = rot_cell(ic, 1) ^ rot_cell(i8, 2) ^ rot_cell(i4, 1);

        o |= (uint64_t)t3 << b;
        o |= (uint64_t)t2 << (b + 4 * 4);
        o |= (uint64_t)t1 << (b + 8 * 4);
        o |= (uint64_t)t0 << (b + 12 * 4);
    }
    return o;
}